

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testopal.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  ushort uVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  Am_Constraint *pAVar6;
  Am_Object AVar7;
  Am_Object AVar8;
  ostream *poVar9;
  Am_Object AVar10;
  Am_Object AVar11;
  Am_Object AVar12;
  Am_Object AVar13;
  Am_Object AVar14;
  Am_Object AVar15;
  char *pcVar16;
  Am_Object AVar17;
  Am_Object AVar18;
  Am_Object foo_group;
  Am_Object object;
  Am_Object noo_group;
  int y;
  int x;
  Am_Style thick_orange_line;
  Am_Point_List triangle;
  Am_Object r3;
  Am_Object l2;
  Am_Style bevel;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Image_Array local_40 [8];
  Am_Image_Array local_38 [8];
  Am_Object local_30;
  
  Am_Initialize();
  Am_Object::Create((char *)&triangle);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar2 = Am_Object::Set((ushort)&triangle,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,0x32);
  uVar2 = Am_Object::Set(uVar2,0x65,200);
  uVar2 = Am_Object::Set(uVar2,0x66,200);
  uVar2 = Am_Object::Set(uVar2,0x67,0xdc);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(char *)0x6c,0x1073e6);
  Am_Object::operator=(&window,pAVar5);
  Am_Object::~Am_Object((Am_Object *)&triangle);
  Am_Object::Create((char *)&triangle);
  Am_Object::operator=(&inter,(Am_Object *)&triangle);
  Am_Object::~Am_Object((Am_Object *)&triangle);
  Am_Object::Set(0xa2f0,(char *)0xb9,0x1073ff);
  Am_Object::Set(0xa2f0,0xcb,0);
  Am_Object::Get_Object((ushort)&triangle,0x10a2f0);
  Am_Object::Set((ushort)&triangle,(Am_Method_Wrapper *)0xca,(ulong)change_setting.from_wrapper);
  Am_Object::~Am_Object((Am_Object *)&triangle);
  AVar1 = KEY;
  Am_Object::Am_Object(&local_30,&inter);
  AVar7.data._2_6_ = 0;
  AVar7.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xa2e8,AVar7,(ulong)&local_30);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Create((char *)&triangle);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar2 = Am_Object::Set((ushort)&triangle,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,0x14);
  uVar2 = Am_Object::Set(uVar2,0x65,0x96);
  uVar2 = Am_Object::Set(uVar2,0x66,0x50);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,0x67,0x3c);
  Am_Object::operator=(&sw,pAVar5);
  Am_Object::~Am_Object((Am_Object *)&triangle);
  Am_Object::Create((char *)&triangle);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  uVar2 = Am_Object::Set((ushort)&triangle,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,10);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  uVar2 = Am_Object::Set(uVar2,0x66,0xb4);
  uVar2 = Am_Object::Set(uVar2,0x67,0xb4);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)rect_width);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x66,(ulong)pAVar6);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)rect_height);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar6);
  Am_Object::operator=(&r1,pAVar5);
  Am_Object::~Am_Object((Am_Object *)&triangle);
  Am_Point_List::Am_Point_List(&triangle,main::tria,8);
  Am_Object::Create((char *)&bevel);
  pAVar4 = Am_Point_List::operator_cast_to_Am_Wrapper_(&triangle);
  pAVar5 = (Am_Object *)Am_Object::Set((ushort)&bevel,(Am_Wrapper *)0xb2,(ulong)pAVar4);
  Am_Object::operator=(&t1,pAVar5);
  Am_Object::~Am_Object((Am_Object *)&bevel);
  Am_Image_Array::Am_Image_Array(local_38,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x0,0,0,&bevel,0x1e,1,2,0,&Am_DEFAULT_DASH_LIST,2,0,0,local_38);
  Am_Image_Array::~Am_Image_Array(local_38);
  Am_Object::Create((char *)&r3);
  uVar2 = Am_Object::Set((ushort)&r3,100,0x14);
  uVar2 = Am_Object::Set(uVar2,0x65,0x14);
  uVar2 = Am_Object::Set(uVar2,0x66,0x78);
  uVar2 = Am_Object::Set(uVar2,0x67,0x5a);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&bevel);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar4);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::operator=(&r2,pAVar5);
  Am_Object::~Am_Object(&r3);
  Am_Object::Create((char *)&thick_orange_line);
  uVar2 = Am_Object::Add((ushort)&thick_orange_line,true,0);
  uVar2 = Am_Object::Add(uVar2,true,0);
  uVar2 = Am_Object::Set(uVar2,100,0x14);
  uVar2 = Am_Object::Set(uVar2,0x65,0x14);
  uVar2 = Am_Object::Set(uVar2,0x66,0x78);
  uVar2 = Am_Object::Set(uVar2,0x67,0x5a);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)rect_fill);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x6a,(ulong)pAVar6);
  Am_Object::Am_Object(&r3,pAVar5);
  Am_Object::~Am_Object((Am_Object *)&thick_orange_line);
  Am_Object::Create((char *)&thick_orange_line);
  uVar2 = Am_Object::Set((ushort)&thick_orange_line,100,10);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  uVar2 = Am_Object::Set(uVar2,0x66,0x3c);
  uVar2 = Am_Object::Set(uVar2,0x67,0x28);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::operator=(&r4,pAVar5);
  Am_Object::~Am_Object((Am_Object *)&thick_orange_line);
  Am_Image_Array::Am_Image_Array(local_40,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x3f400000,0x3e800000,0,&thick_orange_line,5,1,0,0,
                     &Am_DEFAULT_DASH_LIST,2,0,0,local_40);
  Am_Image_Array::~Am_Image_Array(local_40);
  Am_Object::Create((char *)&l2);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&thick_orange_line);
  uVar2 = Am_Object::Set((ushort)&l2,(Am_Wrapper *)0x6b,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,0x8b,0x46);
  uVar2 = Am_Object::Set(uVar2,0x8c,0xf);
  uVar2 = Am_Object::Set(uVar2,0x8d,0x91);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,0x8e,0x91);
  Am_Object::operator=(&l1,pAVar5);
  Am_Object::~Am_Object(&l2);
  Am_Object::Create((char *)&object);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)at_sw_x);
  uVar2 = Am_Object::Set((ushort)&object,(Am_Constraint *)0x8b,(ulong)pAVar6);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)at_sw_y);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x8c,(ulong)pAVar6);
  uVar2 = Am_Object::Set(uVar2,0x8d,0x91);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,0x8e,0x55);
  Am_Object::Am_Object(&l2,pAVar5);
  Am_Object::~Am_Object(&object);
  Am_Object::Create((char *)&object);
  AVar1 = OOK;
  Am_Object::Create((char *)&foo_group);
  uVar2 = Am_Object::Set((ushort)&foo_group,100,0);
  uVar2 = Am_Object::Set(uVar2,0x65,0);
  uVar2 = Am_Object::Set(uVar2,0x66,0x32);
  uVar2 = Am_Object::Set(uVar2,0x67,0x1e);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::Am_Object(&local_48,pAVar5);
  AVar8.data._2_6_ = 0;
  AVar8.data._0_2_ = AVar1;
  uVar2 = Am_Object::Add_Part((ushort)&object,AVar8,(ulong)&local_48);
  AVar1 = EEK_SLOT;
  Am_Object::Create((char *)&noo_group);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar3 = Am_Object::Set((ushort)&noo_group,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar3 = Am_Object::Set(uVar3,100,5);
  uVar3 = Am_Object::Set(uVar3,0x65,5);
  uVar3 = Am_Object::Set(uVar3,0x66,0x32);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar3,0x67,0x1e);
  pAVar5 = (Am_Object *)Am_Object::operator=(&eek,pAVar5);
  Am_Object::Am_Object(&local_50,pAVar5);
  AVar10.data._2_6_ = 0;
  AVar10.data._0_2_ = AVar1;
  uVar2 = Am_Object::Add_Part(uVar2,AVar10,(ulong)&local_50);
  uVar2 = Am_Object::Set(uVar2,100,0x8c);
  uVar2 = Am_Object::Set(uVar2,0x65,0x96);
  uVar2 = Am_Object::Set(uVar2,0x66,0x37);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,0x67,0x23);
  Am_Object::operator=(&g1,pAVar5);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&noo_group);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&foo_group);
  Am_Object::~Am_Object(&object);
  Am_Object::Am_Object(&local_58,&window);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_58,0),1);
  Am_Object::~Am_Object(&local_58);
  AVar1 = PART1;
  Am_Object::Am_Object(&local_60,&r1);
  AVar11.data._2_6_ = 0;
  AVar11.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xa2e8,AVar11,(ulong)&local_60);
  Am_Object::~Am_Object(&local_60);
  Am_Object::Am_Object(&local_68,&r3);
  Am_Object::Add_Part((Am_Object)0x10a2e8,SUB81(&local_68,0),1);
  Am_Object::~Am_Object(&local_68);
  Am_Object::Am_Object(&local_70,&r2);
  Am_Object::Add_Part((Am_Object)0x10a2e8,SUB81(&local_70,0),1);
  Am_Object::~Am_Object(&local_70);
  AVar1 = LINE1;
  Am_Object::Am_Object(&local_78,&l1);
  AVar12.data._2_6_ = 0;
  AVar12.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xa2e8,AVar12,(ulong)&local_78);
  Am_Object::~Am_Object(&local_78);
  Am_Object::Am_Object(&local_80,&l2);
  Am_Object::Add_Part((Am_Object)0x10a2e8,SUB81(&local_80,0),1);
  Am_Object::~Am_Object(&local_80);
  AVar1 = PART2;
  Am_Object::Am_Object(&local_88,&g1);
  AVar13.data._2_6_ = 0;
  AVar13.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xa2e8,AVar13,(ulong)&local_88);
  Am_Object::~Am_Object(&local_88);
  AVar1 = PART3;
  Am_Object::Am_Object(&local_90,&sw);
  AVar14.data._2_6_ = 0;
  AVar14.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xa2e8,AVar14,(ulong)&local_90);
  Am_Object::~Am_Object(&local_90);
  AVar1 = TRI1;
  Am_Object::Am_Object(&local_98,&t1);
  AVar15.data._2_6_ = 0;
  AVar15.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xa2e8,AVar15,(ulong)&local_98);
  Am_Object::~Am_Object(&local_98);
  Am_Object::Am_Object(&local_a0,&r4);
  Am_Object::Add_Part((Am_Object)0x10a308,SUB81(&local_a0,0),1);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::Create((char *)&object);
  uVar2 = Am_Object::Set((ushort)&object,(char *)0x6c,0x10744e);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  AVar7.data = (Am_Object_Data *)Am_Object::Set(uVar2,0x65,0x28);
  Am_Object::Create((char *)&foo_group);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)win_parrot_left);
  uVar2 = Am_Object::Set((ushort)&foo_group,(Am_Constraint *)0x64,(ulong)pAVar6);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)win_parrot_top);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar6);
  uVar2 = Am_Object::Set(uVar2,0x66,500);
  AVar8.data = (Am_Object_Data *)Am_Object::Set(uVar2,0x67,500);
  Am_Object::Create((char *)&noo_group);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar2 = Am_Object::Set((ushort)&noo_group,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,0x6b,0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)parrot_left);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x64,(ulong)pAVar6);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)parrot_top);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar6);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)parrot_width);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x66,(ulong)pAVar6);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)parrot_height);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar6);
  Am_Object::Am_Object(&local_b8,pAVar5);
  pAVar5 = (Am_Object *)Am_Object::Add_Part(AVar8,SUB81(&local_b8,0),1);
  Am_Object::Am_Object(&local_b0,pAVar5);
  pAVar5 = (Am_Object *)Am_Object::Add_Part(AVar7,SUB81(&local_b0,0),1);
  Am_Object::Am_Object(&local_a8,pAVar5);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_a8,0),1);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&noo_group);
  Am_Object::~Am_Object(&foo_group);
  Am_Object::~Am_Object(&object);
  Am_Point_In_Part(&object,0x10a2e8,0x5a,(Am_Object *)0x3c,true,false);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&object);
  if (pAVar4 == (Am_Wrapper *)0x0) {
    pcVar16 = "No Part of Window at 60x180";
    poVar9 = (ostream *)&std::cout;
  }
  else {
    poVar9 = std::operator<<((ostream *)&std::cout,"Part of Window at 90x60 is ");
    poVar9 = (ostream *)operator<<(poVar9,&object);
    pcVar16 = " [r2]";
  }
  poVar9 = std::operator<<(poVar9,pcVar16);
  std::endl<char,std::char_traits<char>>(poVar9);
  Am_Point_In_Leaf(&foo_group,0x10a2e8,0xa0,(Am_Object *)0xa0,true,true);
  Am_Object::operator=(&object,&foo_group);
  Am_Object::~Am_Object(&foo_group);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&object);
  if (pAVar4 == (Am_Wrapper *)0x0) {
    pcVar16 = "No Leaf of Window at 160x160";
    poVar9 = (ostream *)&std::cout;
  }
  else {
    poVar9 = std::operator<<((ostream *)&std::cout,"Leaf of Window at 160x160 is ");
    poVar9 = (ostream *)operator<<(poVar9,&object);
    pcVar16 = " [eek]";
  }
  poVar9 = std::operator<<(poVar9,pcVar16);
  std::endl<char,std::char_traits<char>>(poVar9);
  Am_Point_In_Obj(&foo_group,0x10a310,0x50,(Am_Object *)0x32);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&foo_group);
  Am_Object::~Am_Object(&foo_group);
  pcVar16 = "Window point 90x60 is in r1";
  if (pAVar4 == (Am_Wrapper *)0x0) {
    pcVar16 = "Window point 90x60 is not in r1";
  }
  poVar9 = std::operator<<((ostream *)&std::cout,pcVar16);
  std::endl<char,std::char_traits<char>>(poVar9);
  Am_Translate_Coordinates(&r2,10,10,&r1,&x,&y);
  poVar9 = std::operator<<((ostream *)&std::cout,"Coordinate (10x10) in r2 is coordinate (");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,x);
  poVar9 = std::operator<<(poVar9,"x");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,y);
  poVar9 = std::operator<<(poVar9,") in r1 [20x20]");
  std::endl<char,std::char_traits<char>>(poVar9);
  Am_Translate_Coordinates(&r2,10,10,&r3,&x,&y);
  poVar9 = std::operator<<((ostream *)&std::cout,"Coordinate (10x10) in r2 is coordinate (");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,x);
  poVar9 = std::operator<<(poVar9,"x");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,y);
  poVar9 = std::operator<<(poVar9,") in r3 [10x10]");
  std::endl<char,std::char_traits<char>>(poVar9);
  Am_Translate_Coordinates(&eek,10,10,&r1,&x,&y);
  poVar9 = std::operator<<((ostream *)&std::cout,"Coordinate (10x10) in eek is coordinate (");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,x);
  poVar9 = std::operator<<(poVar9,"x");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,y);
  poVar9 = std::operator<<(poVar9,") in r1 [145x155]");
  std::endl<char,std::char_traits<char>>(poVar9);
  Am_Translate_Coordinates(&r4,10,10,&r1,&x,&y);
  poVar9 = std::operator<<((ostream *)&std::cout,"Coordinate (10x10) in r4 is coordinate (");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,x);
  poVar9 = std::operator<<(poVar9,"x");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,y);
  poVar9 = std::operator<<(poVar9,") in r1 [30x160]");
  std::endl<char,std::char_traits<char>>(poVar9);
  print_help();
  if (1 < argc) {
    Am_Create_Screen((char *)&foo_group);
    Am_Object::operator=(&screen2,&foo_group);
    Am_Object::~Am_Object(&foo_group);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&screen2);
    if (pAVar4 != (Am_Wrapper *)0x0) {
      Am_Object::Create((char *)&foo_group);
      uVar2 = Am_Object::Set((ushort)&foo_group,0x66,200);
      uVar2 = Am_Object::Set(uVar2,0x67,100);
      uVar2 = Am_Object::Set(uVar2,(char *)0x6c,0x1075fa);
      AVar7.data = (Am_Object_Data *)Am_Object::Set(uVar2,true,1);
      Am_Object::Create((char *)&noo_group);
      uVar2 = Am_Object::Set((ushort)&noo_group,100,0x32);
      uVar2 = Am_Object::Set(uVar2,0x65,0x19);
      uVar2 = Am_Object::Set(uVar2,0x66,100);
      uVar2 = Am_Object::Set(uVar2,0x67,0x32);
      pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Yellow);
      pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
      Am_Object::Am_Object(&local_c8,pAVar5);
      pAVar5 = (Am_Object *)Am_Object::Add_Part(AVar7,SUB81(&local_c8,0),1);
      Am_Object::Am_Object(&local_c0,pAVar5);
      Am_Object::Add_Part((Am_Object)0x10a348,SUB81(&local_c0,0),1);
      Am_Object::~Am_Object(&local_c0);
      Am_Object::~Am_Object(&local_c8);
      Am_Object::~Am_Object(&noo_group);
      Am_Object::~Am_Object(&foo_group);
    }
  }
  Am_Object::Create((char *)&noo_group);
  AVar1 = PART1;
  Am_Object::Create((char *)&local_d0);
  AVar17.data._2_6_ = 0;
  AVar17.data._0_2_ = AVar1;
  pAVar5 = (Am_Object *)Am_Object::Add_Part((ushort)&noo_group,AVar17,(ulong)&local_d0);
  Am_Object::Am_Object(&foo_group,pAVar5);
  Am_Object::~Am_Object(&local_d0);
  Am_Object::~Am_Object(&noo_group);
  Am_Object::Create((char *)&local_d8);
  AVar1 = PART1;
  Am_Object::Create((char *)&local_e0);
  AVar18.data._2_6_ = 0;
  AVar18.data._0_2_ = AVar1;
  pAVar5 = (Am_Object *)Am_Object::Set_Part((ushort)&local_d8,AVar18,(ulong)&local_e0);
  Am_Object::Am_Object(&noo_group,pAVar5);
  Am_Object::~Am_Object(&local_e0);
  Am_Object::~Am_Object(&local_d8);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&noo_group);
  Am_Object::~Am_Object(&foo_group);
  Am_Object::~Am_Object(&object);
  Am_Object::~Am_Object(&l2);
  Am_Style::~Am_Style(&thick_orange_line);
  Am_Object::~Am_Object(&r3);
  Am_Style::~Am_Style(&bevel);
  Am_Point_List::~Am_Point_List(&triangle);
  return 0;
}

Assistant:

int
main(int argc, char **argv)
{
  Am_Initialize();

  window = Am_Window.Create("window")
               .Set(Am_FILL_STYLE, Am_Red)
               .Set(Am_LEFT, 50)
               .Set(Am_TOP, 200)
               .Set(Am_WIDTH, 200)
               .Set(Am_HEIGHT, 220)
               .Set(Am_TITLE, "Test Opal");

  inter = Am_Choice_Interactor.Create("keyboard press");
  inter.Set(Am_START_WHEN, "ANY_KEYBOARD");
  inter.Set(Am_CONTINUOUS, 0);
  inter.Get_Object(Am_COMMAND).Set(Am_DO_METHOD, change_setting);

  window.Add_Part(KEY, inter);

  sw = Am_Window.Create("sub window")
           .Set(Am_FILL_STYLE, Am_Blue)
           .Set(Am_LEFT, 20)
           .Set(Am_TOP, 150)
           .Set(Am_WIDTH, 80)
           .Set(Am_HEIGHT, 60);

  r1 = Am_Rectangle.Create("r1")
           .Set(Am_FILL_STYLE, Am_Green)
           .Set(Am_LEFT, 10)
           .Set(Am_TOP, 10)
           .Set(Am_WIDTH, 180)
           .Set(Am_HEIGHT, 180)
           .Set(Am_WIDTH, rect_width)
           .Set(Am_HEIGHT, rect_height);

  static int tria[8] = {50, 100, 100, 200, 150, 100, 50, 100};
  Am_Point_List triangle(tria, 8);
  t1 = Am_Polygon.Create("triangle").Set(Am_POINT_LIST, triangle);

  Am_Style bevel(0, 0, 0, 30, Am_CAP_BUTT, Am_JOIN_BEVEL);
  r2 = Am_Rectangle.Create("r2")
           .Set(Am_LEFT, 20)
           .Set(Am_TOP, 20)
           .Set(Am_WIDTH, 120)
           .Set(Am_HEIGHT, 90)
           .Set(Am_LINE_STYLE, bevel)
           .Set(Am_FILL_STYLE, Am_Blue);

  Am_Object r3 = Am_Rectangle.Create("r3")
                     .Add(Am_SELECTED, false)
                     .Add(Am_INTERIM_SELECTED, false)
                     .Set(Am_LEFT, 20)
                     .Set(Am_TOP, 20)
                     .Set(Am_WIDTH, 120)
                     .Set(Am_HEIGHT, 90)
                     .Set(Am_FILL_STYLE, rect_fill);

  r4 = Am_Rectangle.Create("r4")
           .Set(Am_LEFT, 10)
           .Set(Am_TOP, 10)
           .Set(Am_WIDTH, 60)
           .Set(Am_HEIGHT, 40)
           .Set(Am_FILL_STYLE, Am_White);

  Am_Style thick_orange_line(0.75, 0.25, 0.0, 5);
  l1 = Am_Line.Create("line1")
           .Set(Am_LINE_STYLE, thick_orange_line)
           .Set(Am_X1, 70)
           .Set(Am_Y1, 15)
           .Set(Am_X2, 145)
           .Set(Am_Y2, 145);
  Am_Object l2 = l1.Create("line2")
                     .Set(Am_X1, at_sw_x)
                     .Set(Am_Y1, at_sw_y)
                     .Set(Am_X2, 145)
                     .Set(Am_Y2, 85);

  g1 = Am_Group.Create("g1")
           .Add_Part(OOK, Am_Rectangle.Create("ook")
                              .Set(Am_LEFT, 0)
                              .Set(Am_TOP, 0)
                              .Set(Am_WIDTH, 50)
                              .Set(Am_HEIGHT, 30)
                              .Set(Am_FILL_STYLE, Am_White))
           .Add_Part(EEK_SLOT, eek = Am_Rectangle.Create("eek")
                                         .Set(Am_FILL_STYLE, Am_Blue)
                                         .Set(Am_LEFT, 5)
                                         .Set(Am_TOP, 5)
                                         .Set(Am_WIDTH, 50)
                                         .Set(Am_HEIGHT, 30))
           .Set(Am_LEFT, 140)
           .Set(Am_TOP, 150)
           .Set(Am_WIDTH, 55)
           .Set(Am_HEIGHT, 35);

  Am_Screen.Add_Part(window);
  window.Add_Part(PART1, r1);
  window.Add_Part(r3);
  window.Add_Part(r2);
  window.Add_Part(LINE1, l1);
  window.Add_Part(l2);
  window.Add_Part(PART2, g1);
  window.Add_Part(PART3, sw);
  window.Add_Part(TRI1, t1);
  sw.Add_Part(r4);

  Am_Screen.Add_Part(
      Am_Window.Create("filter window")
          .Set(Am_TITLE, "Filter Window")
          .Set(Am_FILL_STYLE, Am_Blue)
          .Set(Am_TOP, 40)
          .Add_Part(Am_Group.Create("win parrot")
                        .Set(Am_LEFT, win_parrot_left)
                        .Set(Am_TOP, win_parrot_top)
                        .Set(Am_WIDTH, 500)
                        .Set(Am_HEIGHT, 500)
                        .Add_Part(Am_Rectangle.Create("sub parrot")
                                      .Set(Am_FILL_STYLE, Am_Red)
                                      .Set(Am_LINE_STYLE, (0L))
                                      .Set(Am_LEFT, parrot_left)
                                      .Set(Am_TOP, parrot_top)
                                      .Set(Am_WIDTH, parrot_width)
                                      .Set(Am_HEIGHT, parrot_height))));

  Am_Object object = Am_Point_In_Part(window, 90, 60, window);
  if (object)
    cout << "Part of Window at 90x60 is " << object << " [r2]" << endl;
  else
    cout << "No Part of Window at 60x180" << endl;
  object = Am_Point_In_Leaf(window, 160, 160, window);
  if (object)
    cout << "Leaf of Window at 160x160 is " << object << " [eek]" << endl;
  else
    cout << "No Leaf of Window at 160x160" << endl;
  if (Am_Point_In_Obj(r1, 80, 50, window))
    cout << "Window point 90x60 is in r1" << endl;
  else
    cout << "Window point 90x60 is not in r1" << endl;

  int x, y;
  Am_Translate_Coordinates(r2, 10, 10, r1, x, y);
  cout << "Coordinate (10x10) in r2 is coordinate (" << x << "x" << y
       << ") in r1 [20x20]" << endl;
  Am_Translate_Coordinates(r2, 10, 10, r3, x, y);
  cout << "Coordinate (10x10) in r2 is coordinate (" << x << "x" << y
       << ") in r3 [10x10]" << endl;
  Am_Translate_Coordinates(eek, 10, 10, r1, x, y);
  cout << "Coordinate (10x10) in eek is coordinate (" << x << "x" << y
       << ") in r1 [145x155]" << endl;
  Am_Translate_Coordinates(r4, 10, 10, r1, x, y);
  cout << "Coordinate (10x10) in r4 is coordinate (" << x << "x" << y
       << ") in r1 [30x160]" << endl;

  print_help();

  if (argc > 1) {
    screen2 = Am_Create_Screen(argv[1]);
    if (screen2)
      screen2.Add_Part(Am_Window.Create("other screen")
                           .Set(Am_WIDTH, 200)
                           .Set(Am_HEIGHT, 100)
                           .Set(Am_TITLE, "Another Screen")
                           .Set(Am_QUERY_POSITION, true)
                           .Add_Part(Am_Rectangle.Create("other rectangle")
                                         .Set(Am_LEFT, 50)
                                         .Set(Am_TOP, 25)
                                         .Set(Am_WIDTH, 100)
                                         .Set(Am_HEIGHT, 50)
                                         .Set(Am_FILL_STYLE, Am_Yellow)));
  }

  Am_Object foo_group =
      Am_Group.Create("foo").Add_Part(PART1, Am_Rectangle.Create("bar"));
  Am_Object noo_group =
      foo_group.Create("noo").Set_Part(PART1, Am_Rectangle.Create("bart"));

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}